

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitStringTest_x_iutest_x_ToOctString_Test::Body
          (iu_UnitStringTest_x_iutest_x_ToOctString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  type **in_stack_ffffffffffffeed8;
  AssertionHelper local_1020;
  Fixed local_ff0;
  string local_e68;
  undefined1 local_e48 [8];
  AssertionResult iutest_ar_7;
  Fixed local_df0;
  string local_c68;
  undefined1 local_c48 [8];
  AssertionResult iutest_ar_6;
  Fixed local_bf0;
  string local_a68;
  undefined1 local_a48 [8];
  AssertionResult iutest_ar_5;
  Fixed local_9f0;
  string local_868;
  undefined1 local_848 [8];
  AssertionResult iutest_ar_4;
  Fixed local_7f0;
  string local_668;
  undefined1 local_648 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5f0;
  string local_468;
  undefined1 local_448 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3f0;
  string local_268;
  undefined1 local_248 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1f0;
  string local_58;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_UnitStringTest_x_iutest_x_ToOctString_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::detail::ToOctString<unsigned_char>(&local_58,'\0');
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_38,(internal *)"\"000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt8 >(0)","000",(char *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd7,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  iutest::detail::ToOctString<unsigned_short>(&local_268,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_248,(internal *)"\"000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt16 >(0)","000000",(char *)&local_268,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string((string *)&local_268);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    memset(&local_3f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_248);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd8,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  iutest::detail::AlwaysZero();
  iutest::detail::ToOctString<unsigned_int>(&local_468,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_448,(internal *)"\"00000000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt32 >(0)","00000000000",(char *)&local_468
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string((string *)&local_468);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    memset(&local_5f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_448);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xd9,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  iutest::detail::AlwaysZero();
  iutest::detail::ToOctString<unsigned_long>(&local_668,0);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_648,(internal *)"\"0000000000000000000000\"",
             "::iutest::detail::ToOctString< ::iutest::UInt64 >(0)","0000000000000000000000",
             (char *)&local_668,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string((string *)&local_668);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
  if (!bVar1) {
    memset(&local_7f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_648);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xda,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_7f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_648);
  iutest::detail::AlwaysZero();
  iutest::detail::ToOctString<long>(&local_868,-1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_848,(internal *)"\"1777777777777777777777\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >(-1)","1777777777777777777777",
             (char *)&local_868,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string((string *)&local_868);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
  if (!bVar1) {
    memset(&local_9f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_848);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xdb,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_9f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_848);
  iutest::detail::AlwaysZero();
  iutest::detail::ToOctString<long>(&local_a68,0x7fffffffffffffff);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_a48,(internal *)"\"0777777777777777777777\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >((9223372036854775807L))",
             "0777777777777777777777",(char *)&local_a68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string((string *)&local_a68);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
  if (!bVar1) {
    memset(&local_bf0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_bf0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_a48);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xdd,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_bf0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_bf0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
  iutest::detail::AlwaysZero();
  iutest::detail::ToOctString<long>(&local_c68,-0x8000000000000000);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_c48,(internal *)"\"1000000000000000000000\"",
             "::iutest::detail::ToOctString< ::iutest::Int64 >((-9223372036854775807L-1))",
             "1000000000000000000000",(char *)&local_c68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string((string *)&local_c68);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    memset(&local_df0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_df0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_c48);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_7.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xde,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_7.m_result,&local_df0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_7.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_df0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  iutest::detail::AlwaysZero();
  iutest::detail::ToOctString<unsigned_char>(&local_e68,0xff);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_e48,(internal *)"\"377\"",
             "::iutest::detail::ToOctString< ::iutest::UInt8 >(0377u)","377",(char *)&local_e68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeed8);
  std::__cxx11::string::~string((string *)&local_e68);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e48);
  if (!bVar1) {
    memset(&local_ff0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_ff0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_e48);
    iutest::AssertionHelper::AssertionHelper
              (&local_1020,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0xe0,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_1020,&local_ff0);
    iutest::AssertionHelper::~AssertionHelper(&local_1020);
    iutest::AssertionHelper::Fixed::~Fixed(&local_ff0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_e48);
  return;
}

Assistant:

IUTEST(UnitStringTest, ToOctString)
{
    IUTEST_EXPECT_STREQ(                   "000", ::iutest::detail::ToOctString< ::iutest::UInt8  >(0));
    IUTEST_EXPECT_STREQ(                "000000", ::iutest::detail::ToOctString< ::iutest::UInt16 >(0));
    IUTEST_EXPECT_STREQ(           "00000000000", ::iutest::detail::ToOctString< ::iutest::UInt32 >(0));
    IUTEST_EXPECT_STREQ("0000000000000000000000", ::iutest::detail::ToOctString< ::iutest::UInt64 >(0));
    IUTEST_EXPECT_STREQ("1777777777777777777777", ::iutest::detail::ToOctString< ::iutest::Int64 >(-1));
#if defined(INT64_MAX)
    IUTEST_EXPECT_STREQ("0777777777777777777777", ::iutest::detail::ToOctString< ::iutest::Int64 >(INT64_MAX));
    IUTEST_EXPECT_STREQ("1000000000000000000000", ::iutest::detail::ToOctString< ::iutest::Int64 >(INT64_MIN));
#endif
    IUTEST_EXPECT_STREQ(                   "377", ::iutest::detail::ToOctString< ::iutest::UInt8  >(0377u));
}